

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_parse.cpp
# Opt level: O0

param * param_parse::parse(int argc,char **argv)

{
  char *__lhs;
  bool bVar1;
  ostream *poVar2;
  run_param *prVar3;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_18 = argv;
  argv_local._4_4_ = argc;
  if (argc == 1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"please use: ");
    poVar2 = std::operator<<(poVar2,*local_18);
    poVar2 = std::operator<<(poVar2," run --help");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  __lhs = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"run",&local_39);
  bVar1 = std::operator==(__lhs,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"unsupport command: \'");
    poVar2 = std::operator<<(poVar2,local_18[1]);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cerr,"please use: ");
    poVar2 = std::operator<<(poVar2,*local_18);
    poVar2 = std::operator<<(poVar2," run --help");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  prVar3 = run_param_parse::parse(argv_local._4_4_,local_18);
  return &prVar3->super_param;
}

Assistant:

param *param_parse::parse(int argc, char *argv[]) {
  if (argc == 1) {
    std::cerr << "please use: " << argv[0] << " run --help" << std::endl;
    exit(-1);
  }

  if (argv[1] == string("run")) {
    return run_param_parse::parse(argc, argv);
  } else {
    std::cerr << "unsupport command: '" << argv[1] << "'" << std::endl;
    std::cerr << "please use: " << argv[0] << " run --help" << std::endl;
    exit(-1);
  }
}